

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.c
# Opt level: O0

SeatPromptResult * console_get_userpass_input(SeatPromptResult *__return_storage_ptr__,prompts_t *p)

{
  FILE *pFVar1;
  _Bool _Var2;
  ssize_t sVar3;
  int *piVar4;
  ptrlen pVar5;
  ptrlen pVar6;
  SeatPromptResult local_180;
  SeatPromptResult local_160;
  int local_13c;
  void *pvStack_138;
  int ret;
  void *ptr;
  size_t prev_result_len;
  size_t toread;
  undefined1 auStack_118 [7];
  _Bool failed;
  undefined8 *local_108;
  prompt_t *pr;
  termios newmode;
  termios oldmode;
  ptrlen plinst;
  ptrlen plname;
  int i;
  int infd;
  FILE *outfp;
  size_t curr_prompt;
  prompts_t *p_local;
  
  _i = (FILE *)0x0;
  curr_prompt = (size_t)p;
  for (plname.len._0_4_ = 0; (ulong)(long)(int)plname.len < *(ulong *)(curr_prompt + 0x28);
      plname.len._0_4_ = (int)plname.len + 1) {
    prompt_set_result(*(prompt_t **)(*(long *)(curr_prompt + 0x38) + (long)(int)plname.len * 8),"");
  }
  if ((*(long *)(curr_prompt + 0x28) == 0) || ((console_batch_mode & 1U) == 0)) {
    console_open((FILE **)&i,(int *)((long)&plname.len + 4));
    if (((*(byte *)(curr_prompt + 0x10) & 1) != 0) && (*(long *)(curr_prompt + 8) != 0)) {
      pVar5 = ptrlen_from_asciz(*(char **)(curr_prompt + 8));
      console_write(_i,pVar5);
      pVar6 = make_ptrlen("\n",1);
      _Var2 = ptrlen_endswith(pVar5,pVar6,(ptrlen *)0x0);
      pFVar1 = _i;
      if (!_Var2) {
        pVar5 = make_ptrlen("\n",1);
        console_write(pFVar1,pVar5);
      }
    }
    if (*(long *)(curr_prompt + 0x18) != 0) {
      pVar5 = ptrlen_from_asciz(*(char **)(curr_prompt + 0x18));
      console_write(_i,pVar5);
      pVar6 = make_ptrlen("\n",1);
      _Var2 = ptrlen_endswith(pVar5,pVar6,(ptrlen *)0x0);
      pFVar1 = _i;
      if (!_Var2) {
        pVar5 = make_ptrlen("\n",1);
        console_write(pFVar1,pVar5);
      }
    }
    for (outfp = (FILE *)0x0; outfp < *(FILE **)(curr_prompt + 0x28);
        outfp = (FILE *)((long)&outfp->_flags + 1)) {
      local_108 = *(undefined8 **)(*(long *)(curr_prompt + 0x38) + (long)outfp * 8);
      tcgetattr(plname.len._4_4_,(termios *)&newmode.c_ispeed);
      memcpy(&pr,&newmode.c_ispeed,0x3c);
      if ((*(byte *)(local_108 + 1) & 1) == 0) {
        newmode.c_oflag = newmode.c_oflag & 0xfffffff7 | 3;
      }
      else {
        newmode.c_oflag = newmode.c_oflag | 0xb;
      }
      tcsetattr(plname.len._4_4_,0,(termios *)&pr);
      pFVar1 = _i;
      _auStack_118 = ptrlen_from_asciz((char *)*local_108);
      console_write(pFVar1,_auStack_118);
      toread._7_1_ = 0;
      do {
        prev_result_len = 0x10000;
        ptr = *(void **)(local_108[2] + 0x10);
        pvStack_138 = strbuf_append((strbuf *)local_108[2],0x10000);
        sVar3 = read(plname.len._4_4_,pvStack_138,prev_result_len);
        local_13c = (int)sVar3;
        if (local_13c == 0) {
          toread._7_1_ = 1;
          make_spr_simple(&local_160,SPRK_USER_ABORT);
          __return_storage_ptr__->kind = local_160.kind;
          *(undefined4 *)&__return_storage_ptr__->field_0x4 = local_160._4_4_;
          __return_storage_ptr__->errfn = local_160.errfn;
          __return_storage_ptr__->errdata_lit = local_160.errdata_lit;
          __return_storage_ptr__->errdata_u = local_160.errdata_u;
          *(undefined4 *)&__return_storage_ptr__->field_0x1c = local_160._28_4_;
          break;
        }
        if (local_13c < 0) {
          toread._7_1_ = 1;
          piVar4 = __errno_location();
          make_spr_sw_abort_errno(&local_180,"Error reading from terminal",*piVar4);
          __return_storage_ptr__->kind = local_180.kind;
          *(undefined4 *)&__return_storage_ptr__->field_0x4 = local_180._4_4_;
          __return_storage_ptr__->errfn = local_180.errfn;
          __return_storage_ptr__->errdata_lit = local_180.errdata_lit;
          __return_storage_ptr__->errdata_u = local_180.errdata_u;
          *(undefined4 *)&__return_storage_ptr__->field_0x1c = local_180._28_4_;
          break;
        }
        strbuf_shrink_to((strbuf *)local_108[2],(long)ptr + (long)local_13c);
        _Var2 = strbuf_chomp((strbuf *)local_108[2],'\n');
      } while (!_Var2);
      tcsetattr(plname.len._4_4_,0,(termios *)&newmode.c_ispeed);
      pFVar1 = _i;
      if ((*(byte *)(local_108 + 1) & 1) == 0) {
        pVar5 = make_ptrlen("\n",1);
        console_write(pFVar1,pVar5);
      }
      if ((toread._7_1_ & 1) != 0) {
        console_close(_i,plname.len._4_4_);
        return __return_storage_ptr__;
      }
    }
    console_close(_i,plname.len._4_4_);
    make_spr_simple(__return_storage_ptr__,SPRK_OK);
  }
  else {
    make_spr_sw_abort_static
              (__return_storage_ptr__,"Cannot answer interactive prompts in batch mode");
  }
  return __return_storage_ptr__;
}

Assistant:

SeatPromptResult console_get_userpass_input(prompts_t *p)
{
    size_t curr_prompt;
    FILE *outfp = NULL;
    int infd;

    /*
     * Zero all the results, in case we abort half-way through.
     */
    {
        int i;
        for (i = 0; i < p->n_prompts; i++)
            prompt_set_result(p->prompts[i], "");
    }

    if (p->n_prompts && console_batch_mode)
        return SPR_SW_ABORT("Cannot answer interactive prompts "
                            "in batch mode");

    console_open(&outfp, &infd);

    /*
     * Preamble.
     */
    /* We only print the `name' caption if we have to... */
    if (p->name_reqd && p->name) {
        ptrlen plname = ptrlen_from_asciz(p->name);
        console_write(outfp, plname);
        if (!ptrlen_endswith(plname, PTRLEN_LITERAL("\n"), NULL))
            console_write(outfp, PTRLEN_LITERAL("\n"));
    }
    /* ...but we always print any `instruction'. */
    if (p->instruction) {
        ptrlen plinst = ptrlen_from_asciz(p->instruction);
        console_write(outfp, plinst);
        if (!ptrlen_endswith(plinst, PTRLEN_LITERAL("\n"), NULL))
            console_write(outfp, PTRLEN_LITERAL("\n"));
    }

    for (curr_prompt = 0; curr_prompt < p->n_prompts; curr_prompt++) {

        struct termios oldmode, newmode;
        prompt_t *pr = p->prompts[curr_prompt];

        tcgetattr(infd, &oldmode);
        newmode = oldmode;
        newmode.c_lflag |= ISIG | ICANON;
        if (!pr->echo)
            newmode.c_lflag &= ~ECHO;
        else
            newmode.c_lflag |= ECHO;
        tcsetattr(infd, TCSANOW, &newmode);

        console_write(outfp, ptrlen_from_asciz(pr->prompt));

        bool failed = false;
        SeatPromptResult spr;
        while (1) {
            size_t toread = 65536;
            size_t prev_result_len = pr->result->len;
            void *ptr = strbuf_append(pr->result, toread);
            int ret = read(infd, ptr, toread);

            if (ret == 0) {
                /* Regard EOF on the terminal as a deliberate user-abort */
                failed = true;
                spr = SPR_USER_ABORT;
                break;
            }

            if (ret < 0) {
                /* Any other failure to read from the terminal is treated as
                 * an unexpected error and reported to the user. */
                failed = true;
                spr = make_spr_sw_abort_errno(
                    "Error reading from terminal", errno);
                break;
            }

            strbuf_shrink_to(pr->result, prev_result_len + ret);
            if (strbuf_chomp(pr->result, '\n'))
                break;
        }

        tcsetattr(infd, TCSANOW, &oldmode);

        if (!pr->echo)
            console_write(outfp, PTRLEN_LITERAL("\n"));

        if (failed) {
            console_close(outfp, infd);
            return spr;
        }
    }

    console_close(outfp, infd);

    return SPR_OK;
}